

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseChunk(xmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  byte bVar1;
  xmlChar xVar2;
  xmlChar *pxVar3;
  xmlParserInputBufferPtr pxVar4;
  xmlDocPtr doc;
  int *piVar5;
  externalSubsetSAXFunc p_Var6;
  int iVar7;
  int iVar8;
  uint uVar9;
  xmlParserInputState xVar10;
  xmlChar *pxVar11;
  _xmlSAXHandler *p_Var12;
  int *piVar13;
  uint uVar14;
  xmlParserErrors code;
  ulong uVar15;
  xmlNodePtr pxVar16;
  byte *pbVar17;
  ulong uVar18;
  ulong uVar20;
  ulong uVar21;
  xmlParserInputPtr pxVar22;
  byte *pbVar23;
  long lVar24;
  long lVar25;
  byte *pbVar26;
  bool bVar27;
  xmlChar *URI;
  xmlChar *prefix;
  char *msg;
  char *pcVar28;
  int local_54;
  xmlChar *local_50;
  xmlChar *local_48;
  uint local_3c;
  xmlValidCtxtPtr local_38;
  byte *pbVar19;
  
  if (size < 0 || ctxt == (xmlParserCtxtPtr)0x0) {
    return 0x73;
  }
  if (chunk == (char *)0x0 && size != 0) {
    return 0x73;
  }
  pxVar22 = ctxt->input;
  if (pxVar22 == (xmlParserInputPtr)0x0) {
    return 0x73;
  }
  if (pxVar22->buf == (xmlParserInputBufferPtr)0x0) {
    return 0x73;
  }
  if (ctxt->disableSAX != 0) goto LAB_0013e6d4;
  *(byte *)&pxVar22->flags = (byte)pxVar22->flags | 0x40;
  if (ctxt->instate == XML_PARSER_START) {
    xmlCtxtInitializeLate(ctxt);
  }
  bVar27 = false;
  if (((terminate == 0) && (chunk != (char *)0x0)) && (size != 0)) {
    bVar27 = chunk[(ulong)(uint)size - 1] == '\r';
    size = size - (uint)bVar27;
  }
  pxVar22 = ctxt->input;
  pxVar11 = pxVar22->cur;
  pxVar3 = pxVar22->base;
  iVar7 = xmlParserInputBufferPush(pxVar22->buf,size,chunk);
  xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar11 - (long)pxVar3);
  pxVar22 = ctxt->input;
  if (iVar7 < 0) {
    xmlCtxtErrIO(ctxt,pxVar22->buf->error,(char *)0x0);
    xmlHaltParser(ctxt);
    goto LAB_0013e6d4;
  }
  if (pxVar22 == (xmlParserInputPtr)0x0) {
switchD_0013e92c_caseD_ffffffff:
    uVar15 = 1000000000;
    if ((ctxt->options & 0x80000) == 0) {
      uVar15 = 10000000;
    }
    if (uVar15 < (ulong)((long)ctxt->input->cur - (long)ctxt->input->base)) {
      xmlFatalErr(ctxt,XML_ERR_RESOURCE_LIMIT,"Buffer size limit exceeded, try XML_PARSE_HUGE\n");
      xmlHaltParser(ctxt);
    }
    if ((ctxt->errNo != 0) && (ctxt->disableSAX != 0)) {
      return ctxt->errNo;
    }
    if (bVar27) {
      pxVar22 = ctxt->input;
      pxVar11 = pxVar22->cur;
      pxVar3 = pxVar22->base;
      iVar7 = xmlParserInputBufferPush(pxVar22->buf,1,"\r");
      xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar11 - (long)pxVar3);
      if (iVar7 < 0) {
        xmlCtxtErrIO(ctxt,ctxt->input->buf->error,(char *)0x0);
        xmlHaltParser(ctxt);
        goto LAB_0013e6d4;
      }
    }
    if (terminate != 0) {
      xVar10 = ctxt->instate;
      if ((xVar10 == XML_PARSER_EOF) || (xVar10 == XML_PARSER_EPILOG)) {
        pxVar4 = ctxt->input->buf;
        if ((pxVar4->encoder != (xmlCharEncodingHandlerPtr)0x0) &&
           ((pxVar4->error == 0 && (iVar7 = xmlBufIsEmpty(pxVar4->raw), iVar7 == 0)))) {
          pcVar28 = "Truncated multi-byte sequence at EOF\n";
          code = XML_ERR_INVALID_CHAR;
LAB_0013f5a1:
          msg = "%s";
          iVar7 = 0;
          pxVar11 = (xmlChar *)0x0;
          goto LAB_0013f5aa;
        }
      }
      else if (ctxt->nameNr < 1) {
        if (xVar10 != XML_PARSER_START) {
          pcVar28 = "Start tag expected, \'<\' not found\n";
          code = XML_ERR_DOCUMENT_EMPTY;
          goto LAB_0013f5a1;
        }
        xmlFatalErr(ctxt,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
      }
      else {
        uVar14 = ctxt->nameNr - 1;
        pxVar11 = ctxt->nameTab[uVar14];
        iVar7 = ctxt->pushTab[uVar14].line;
        msg = "Premature end of data in tag %s line %d\n";
        code = XML_ERR_TAG_NOT_FINISHED;
        pcVar28 = (char *)pxVar11;
LAB_0013f5aa:
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,pxVar11,(xmlChar *)0x0,
                   (xmlChar *)0x0,iVar7,msg,pcVar28);
      }
      if (ctxt->instate != XML_PARSER_EOF) {
        ctxt->instate = XML_PARSER_EOF;
        xmlFinishDocument(ctxt);
      }
    }
    if (ctxt->wellFormed != 0) {
      return 0;
    }
LAB_0013e6d4:
    return ctxt->errNo;
  }
  if (0x1000 < (long)pxVar22->cur - (long)pxVar22->base) {
    xmlParserShrink(ctxt);
  }
  if (ctxt->disableSAX != 0) goto switchD_0013e92c_caseD_ffffffff;
  local_3c = (uint)(terminate == 0);
  local_38 = &ctxt->vctxt;
LAB_0013e8f5:
  pxVar22 = ctxt->input;
  pxVar11 = pxVar22->cur;
  pbVar19 = pxVar22->end;
  uVar15 = (long)pbVar19 - (long)pxVar11;
  if (uVar15 == 0) goto switchD_0013e92c_caseD_ffffffff;
  switch(ctxt->instate) {
  case XML_PARSER_START:
    if (((terminate == 0) && (uVar15 < 4)) ||
       ((*pxVar11 == 'L' &&
        ((((pxVar11[1] == 'o' && (pxVar11[2] == 0xa7)) && (terminate == 0)) &&
         ((uVar15 < 200 && (pxVar11[3] == 0x94)))))))) goto switchD_0013e92c_caseD_ffffffff;
    xmlDetectEncoding(ctxt);
    ctxt->instate = XML_PARSER_XML_DECL;
    break;
  case XML_PARSER_MISC:
  case XML_PARSER_PROLOG:
  case XML_PARSER_EPILOG:
    xmlSkipBlankChars(ctxt);
    pxVar11 = ctxt->input->cur;
    pxVar3 = ctxt->input->end;
    uVar15 = (long)pxVar3 - (long)pxVar11;
    if (pxVar3 == pxVar11) goto switchD_0013e92c_caseD_ffffffff;
    if (*pxVar11 == '<') {
      if ((terminate == 0) && (uVar15 < 2)) goto switchD_0013e92c_caseD_ffffffff;
      if (pxVar11[1] == '!') {
        if ((terminate == 0) && (uVar15 < 3)) goto switchD_0013e92c_caseD_ffffffff;
        if (pxVar11[2] == '-') {
          if ((terminate == 0) && (uVar15 < 4)) goto switchD_0013e92c_caseD_ffffffff;
          if (pxVar11[3] != '-') goto LAB_0013f137;
          if ((terminate == 0) &&
             (pxVar11 = xmlParseLookupString(ctxt,4,"-->",3), pxVar11 == (xmlChar *)0x0))
          goto switchD_0013e92c_caseD_ffffffff;
          xmlParseComment(ctxt);
        }
        else {
          xVar10 = ctxt->instate;
          if (xVar10 != XML_PARSER_MISC) goto LAB_0013f13d;
          if ((terminate == 0) && (uVar15 < 9)) goto switchD_0013e92c_caseD_ffffffff;
          if (((pxVar11[2] != 'D') ||
              (((pxVar11[3] != 'O' || (pxVar11[4] != 'C')) || (pxVar11[5] != 'T')))) ||
             (((pxVar11[6] != 'Y' || (pxVar11[7] != 'P')) || (pxVar11[8] != 'E'))))
          goto LAB_0013f137;
          if ((terminate == 0) && (iVar7 = xmlParseLookupGt(ctxt), iVar7 == 0))
          goto switchD_0013e92c_caseD_ffffffff;
          ctxt->inSubset = 1;
          xmlParseDocTypeDecl(ctxt);
          xVar2 = *ctxt->input->cur;
          if (xVar2 == '>') {
            xmlNextChar(ctxt);
          }
          else if (xVar2 == '[') {
            ctxt->instate = XML_PARSER_DTD;
            break;
          }
          ctxt->inSubset = 2;
          if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
             (p_Var6 = ctxt->sax->externalSubset, p_Var6 != (externalSubsetSAXFunc)0x0)) {
            (*p_Var6)(ctxt->userData,ctxt->intSubName,ctxt->extSubSystem,ctxt->extSubURI);
          }
          ctxt->inSubset = 0;
          xmlCleanSpecialAttr(ctxt);
          ctxt->instate = XML_PARSER_PROLOG;
        }
      }
      else {
        if (pxVar11[1] != '?') goto LAB_0013f137;
        if ((terminate == 0) &&
           (pxVar11 = xmlParseLookupString(ctxt,2,"?>",2), pxVar11 == (xmlChar *)0x0))
        goto switchD_0013e92c_caseD_ffffffff;
        xmlParsePI(ctxt);
      }
      break;
    }
LAB_0013f137:
    xVar10 = ctxt->instate;
LAB_0013f13d:
    if (xVar10 == XML_PARSER_EPILOG) {
      if (ctxt->errNo == 0) {
        xmlFatalErr(ctxt,XML_ERR_DOCUMENT_END,(char *)0x0);
      }
      ctxt->instate = XML_PARSER_EOF;
      xmlFinishDocument(ctxt);
      break;
    }
    goto LAB_0013f459;
  default:
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INTERNAL_ERROR,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s","PP: internal error\n");
    ctxt->instate = XML_PARSER_EOF;
    break;
  case XML_PARSER_DTD:
    if (terminate == 0) {
      uVar15 = (ulong)(uint)ctxt->endCheckState;
      pbVar23 = pxVar11 + ctxt->checkIndex + (ulong)(ctxt->checkIndex == 0);
      pbVar17 = pbVar23;
LAB_0013e9ce:
      uVar21 = 0;
      if (pbVar23 < pbVar19) {
        bVar1 = *pbVar23;
        do {
          while( true ) {
            pbVar26 = pbVar17;
            uVar14 = (uint)uVar15;
            uVar9 = (uint)bVar1;
            pbVar17 = pbVar23;
            if (0x2c < (int)uVar14) break;
            if (uVar14 != 0x20) {
              if (uVar14 != 0) {
LAB_0013ea9e:
                if (uVar14 == uVar9) {
                  uVar15 = uVar21;
                  pbVar26 = pbVar23 + 1;
                }
                goto LAB_0013ead8;
              }
              uVar15 = 0;
              uVar21 = 0;
              if (uVar9 == 0x3b || bVar1 < 0x3b) {
                if ((bVar1 != 0x22) && (bVar1 != 0x27)) goto LAB_0013ead8;
              }
              else if (uVar9 != 0x5d) {
                if ((((uVar9 != 0x3c) || (uVar15 = uVar21, pbVar23[1] != 0x21)) ||
                    (pbVar23[2] != 0x2d)) || (pbVar23[3] != 0x2d)) goto LAB_0013ead8;
                pbVar23 = pbVar23 + 4;
                uVar15 = 0x2d;
                pbVar17 = pbVar23;
                goto LAB_0013e9ce;
              }
LAB_0013ead5:
              uVar15 = (ulong)bVar1;
              goto LAB_0013ead8;
            }
            uVar15 = 0;
            uVar14 = (uint)bVar1;
            if (uVar14 < 0x3f) {
              if ((0x100002600U >> ((ulong)uVar14 & 0x3f) & 1) != 0) {
                uVar15 = 0x20;
                goto LAB_0013ead8;
              }
              if ((ulong)uVar14 == 0x3e) {
LAB_0013f1ea:
                ctxt->checkIndex = 0;
                ctxt->endCheckState = 0;
                goto LAB_0013f1ff;
              }
            }
          }
          if (uVar14 != 0x5d) {
            if (uVar14 != 0x2d) goto LAB_0013ea9e;
            uVar15 = 0x2d;
            if (((bVar1 != 0x2d) || (pbVar23[1] != 0x2d)) || (pbVar23[2] != 0x3e))
            goto LAB_0013ead8;
            pbVar23 = pbVar23 + 3;
            uVar15 = 0;
            pbVar17 = pbVar23;
            goto LAB_0013e9ce;
          }
          if (bVar1 == 0x20) goto LAB_0013ead5;
          if (uVar9 == 0x3e) goto LAB_0013f1ea;
          uVar15 = 0x20;
          if (((byte)(bVar1 - 9) < 2) || (uVar9 == 0xd)) goto LAB_0013ead8;
          uVar15 = 0;
        } while (uVar9 != 0x5d);
        uVar15 = 0x5d;
LAB_0013ead8:
        pbVar23 = pbVar23 + 1;
        pbVar17 = pbVar26;
        goto LAB_0013e9ce;
      }
      if ((((int)uVar15 == 0x2d) || (pbVar19 = pbVar23, (int)uVar15 == 0)) &&
         (pbVar19 = pbVar23 + -3, (long)pbVar23 - (long)pbVar17 < 3)) {
        pbVar19 = pbVar17;
      }
      uVar18 = (long)pbVar19 - (long)pxVar11;
      uVar20 = uVar18;
      if ((long)uVar18 < 1) {
        uVar20 = uVar21;
      }
      if ((long)uVar18 < 0) {
        uVar15 = uVar21;
      }
      ctxt->checkIndex = uVar20;
      ctxt->endCheckState = (int)uVar15;
      if ((long)uVar18 >= 0) goto switchD_0013e92c_caseD_ffffffff;
    }
LAB_0013f1ff:
    xmlParseInternalSubset(ctxt);
    ctxt->inSubset = 2;
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
       (p_Var6 = ctxt->sax->externalSubset, p_Var6 != (externalSubsetSAXFunc)0x0)) {
      (*p_Var6)(ctxt->userData,ctxt->intSubName,ctxt->extSubSystem,ctxt->extSubURI);
    }
    ctxt->inSubset = 0;
    xmlCleanSpecialAttr(ctxt);
    ctxt->instate = XML_PARSER_PROLOG;
    break;
  case XML_PARSER_START_TAG:
    local_48 = (xmlChar *)0x0;
    local_50 = (xmlChar *)0x0;
    iVar7 = pxVar22->line;
    local_54 = 0;
    if ((terminate != 0) || (1 < uVar15)) {
      if (*pxVar11 == '<') {
        if ((terminate == 0) && (iVar8 = xmlParseLookupGt(ctxt), iVar8 == 0))
        goto switchD_0013e92c_caseD_ffffffff;
        if (ctxt->spaceNr == 0) {
          iVar8 = -1;
        }
        else {
          iVar8 = *ctxt->space;
          if (*ctxt->space == -2) {
            iVar8 = -1;
          }
        }
        spacePush(ctxt,iVar8);
        if (ctxt->sax2 == 0) {
          pxVar11 = xmlParseStartTag(ctxt);
        }
        else {
          pxVar11 = xmlParseStartTag2(ctxt,&local_48,&local_50,&local_54);
        }
        if (pxVar11 != (xmlChar *)0x0) {
          if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
              (doc = ctxt->myDoc, doc != (xmlDocPtr)0x0)) &&
             ((ctxt->node != (_xmlNode *)0x0 && (ctxt->node == doc->children)))) {
            uVar14 = xmlValidateRoot(local_38,doc);
            ctxt->valid = ctxt->valid & uVar14;
          }
          pxVar22 = ctxt->input;
          pxVar3 = pxVar22->cur;
          if (*pxVar3 == '>') {
            xmlNextChar(ctxt);
            nameNsPush(ctxt,pxVar11,local_48,local_50,iVar7,local_54);
          }
          else if ((*pxVar3 == '/') && (pxVar3[1] == '>')) {
            pxVar22->cur = pxVar3 + 2;
            pxVar22->col = pxVar22->col + 2;
            if (pxVar3[2] == '\0') {
              xmlParserGrow(ctxt);
            }
            p_Var12 = ctxt->sax;
            if (ctxt->sax2 == 0) {
              if (((p_Var12 != (_xmlSAXHandler *)0x0) &&
                  (p_Var12->endElement != (endElementSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
                (*p_Var12->endElement)(ctxt->userData,pxVar11);
              }
            }
            else {
              if (((p_Var12 != (_xmlSAXHandler *)0x0) &&
                  (p_Var12->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0))
              {
                (*p_Var12->endElementNs)(ctxt->userData,pxVar11,local_48,local_50);
              }
              if (0 < local_54) {
                xmlParserNsPop(ctxt,local_54);
              }
            }
            iVar7 = ctxt->spaceNr;
            if (0 < (long)iVar7) {
              ctxt->spaceNr = iVar7 - 1U;
              piVar5 = ctxt->spaceTab;
              piVar13 = piVar5 + (long)iVar7 + -2;
              if (iVar7 == 1) {
                piVar13 = piVar5;
              }
              ctxt->space = piVar13;
              piVar5[iVar7 - 1U] = -1;
            }
          }
          else {
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_GT_REQUIRED,XML_ERR_FATAL,
                       pxVar11,(xmlChar *)0x0,(xmlChar *)0x0,0,
                       "Couldn\'t find end of Start Tag %s\n",pxVar11);
            iVar7 = ctxt->nodeNr;
            if (0 < (long)iVar7) {
              ctxt->nodeNr = iVar7 - 1U;
              if (iVar7 == 1) {
                pxVar16 = (xmlNodePtr)0x0;
              }
              else {
                pxVar16 = ctxt->nodeTab[(long)iVar7 + -2];
              }
              ctxt->node = pxVar16;
              ctxt->nodeTab[iVar7 - 1U] = (xmlNodePtr)0x0;
            }
            iVar7 = ctxt->spaceNr;
            if (0 < (long)iVar7) {
              ctxt->spaceNr = iVar7 - 1U;
              piVar5 = ctxt->spaceTab;
              piVar13 = piVar5 + (long)iVar7 + -2;
              if (iVar7 == 1) {
                piVar13 = piVar5;
              }
              ctxt->space = piVar13;
              piVar5[iVar7 - 1U] = -1;
            }
            if (0 < local_54) {
              xmlParserNsPop(ctxt,local_54);
            }
          }
          xVar10 = XML_PARSER_CONTENT;
          if (ctxt->nameNr == 0) {
            xVar10 = XML_PARSER_EPILOG;
          }
          ctxt->instate = xVar10;
          break;
        }
        iVar7 = ctxt->spaceNr;
        if (0 < (long)iVar7) {
          ctxt->spaceNr = iVar7 - 1U;
          piVar5 = ctxt->spaceTab;
          piVar13 = piVar5 + (long)iVar7 + -2;
          if (iVar7 == 1) {
            piVar13 = piVar5;
          }
          ctxt->space = piVar13;
          piVar5[iVar7 - 1U] = -1;
        }
      }
      else {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_DOCUMENT_EMPTY,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                   "Start tag expected, \'<\' not found");
      }
      ctxt->instate = XML_PARSER_EOF;
      xmlFinishDocument(ctxt);
    }
    goto switchD_0013e92c_caseD_ffffffff;
  case XML_PARSER_CONTENT:
    if (*pxVar11 == '&') {
      if ((terminate == 0) && (iVar7 = xmlParseLookupChar(ctxt,0x3b), iVar7 == 0))
      goto switchD_0013e92c_caseD_ffffffff;
      xmlParseReference(ctxt);
      break;
    }
    if (*pxVar11 != '<') {
      if ((terminate == 0) && (uVar15 < 300)) {
        pbVar23 = pxVar11 + ctxt->checkIndex;
        pbVar17 = pbVar23;
        if (pbVar23 < pbVar19) {
          pbVar17 = pxVar11 + uVar15;
          do {
            if ((*pbVar23 == 0x26) || (*pbVar23 == 0x3c)) goto LAB_0013f045;
            pbVar23 = pbVar23 + 1;
          } while (pbVar23 < pbVar19);
        }
        lVar24 = (long)pbVar17 - (long)pxVar11;
        lVar25 = lVar24;
        if (lVar24 < 1) {
          lVar25 = 0;
        }
        ctxt->checkIndex = lVar25;
        if (-1 < lVar24) goto switchD_0013e92c_caseD_ffffffff;
      }
LAB_0013f045:
      ctxt->checkIndex = 0;
      xmlParseCharDataInternal(ctxt,local_3c);
      break;
    }
    if ((terminate == 0) && (uVar15 < 2)) goto switchD_0013e92c_caseD_ffffffff;
    xVar2 = pxVar11[1];
    if (xVar2 != '!') {
      if (xVar2 == '?') {
        if ((terminate == 0) &&
           (pxVar11 = xmlParseLookupString(ctxt,2,"?>",2), pxVar11 == (xmlChar *)0x0))
        goto switchD_0013e92c_caseD_ffffffff;
        xmlParsePI(ctxt);
LAB_0013f1cc:
        ctxt->instate = XML_PARSER_CONTENT;
      }
      else {
        if (xVar2 != '/') goto LAB_0013f459;
        ctxt->instate = XML_PARSER_END_TAG;
      }
      break;
    }
    if ((terminate == 0) && (uVar15 < 3)) goto switchD_0013e92c_caseD_ffffffff;
    if (pxVar11[2] == '[') {
      if ((terminate == 0) && (uVar15 < 9)) goto switchD_0013e92c_caseD_ffffffff;
      if ((pxVar11[3] == 'C') &&
         ((((pxVar11[4] == 'D' && (pxVar11[5] == 'A')) && (pxVar11[6] == 'T')) &&
          ((pxVar11[7] == 'A' && (pxVar11[8] == '[')))))) {
        if ((terminate != 0) ||
           (pxVar11 = xmlParseLookupString(ctxt,9,"]]>",3), pxVar11 != (xmlChar *)0x0)) {
          ctxt->instate = XML_PARSER_CDATA_SECTION;
          xmlParseCDSect(ctxt);
          goto LAB_0013f1cc;
        }
        goto switchD_0013e92c_caseD_ffffffff;
      }
    }
    else if (pxVar11[2] == '-') {
      if ((terminate != 0) || (3 < uVar15)) {
        if (pxVar11[3] != '-') goto LAB_0013f459;
        if ((terminate != 0) ||
           (pxVar11 = xmlParseLookupString(ctxt,4,"-->",3), pxVar11 != (xmlChar *)0x0)) {
          xmlParseComment(ctxt);
          goto LAB_0013f1cc;
        }
      }
      goto switchD_0013e92c_caseD_ffffffff;
    }
LAB_0013f459:
    ctxt->instate = XML_PARSER_START_TAG;
    break;
  case XML_PARSER_END_TAG:
    if (terminate == 0) {
      pxVar22 = (xmlParserInputPtr)0x3e;
      iVar7 = xmlParseLookupChar(ctxt,0x3e);
      if (iVar7 == 0) goto switchD_0013e92c_caseD_ffffffff;
    }
    if (ctxt->sax2 == 0) {
      xmlParseEndTag1(ctxt,(int)pxVar22);
      uVar14 = ctxt->nameNr;
    }
    else {
      xmlParseEndTag2(ctxt,ctxt->pushTab + (long)ctxt->nameNr + -1);
      uVar14 = ctxt->nameNr;
      if (0 < (long)(int)uVar14) {
        uVar9 = uVar14 - 1;
        ctxt->nameNr = uVar9;
        if (uVar14 == 1) {
          pxVar11 = (xmlChar *)0x0;
        }
        else {
          pxVar11 = ctxt->nameTab[(long)(int)uVar14 + -2];
        }
        ctxt->name = pxVar11;
        ctxt->nameTab[uVar9] = (xmlChar *)0x0;
        uVar14 = uVar9;
      }
    }
    if (uVar14 != 0) goto LAB_0013f1cc;
    ctxt->instate = XML_PARSER_EPILOG;
    break;
  case XML_PARSER_XML_DECL:
    if ((terminate == 0) && (uVar15 < 2)) goto switchD_0013e92c_caseD_ffffffff;
    if ((*pxVar11 == '<') && (pxVar11[1] == '?')) {
      if (terminate == 0) {
        pxVar11 = xmlParseLookupString(ctxt,2,"?>",2);
        if (pxVar11 == (xmlChar *)0x0) goto switchD_0013e92c_caseD_ffffffff;
        pxVar11 = ctxt->input->cur;
      }
      if (((pxVar11[2] != 'x') || (pxVar11[3] != 'm')) ||
         ((pxVar11[4] != 'l' ||
          ((0x20 < (ulong)pxVar11[5] || ((0x100002600U >> ((ulong)pxVar11[5] & 0x3f) & 1) == 0))))))
      goto LAB_0013ed5e;
      xmlParseXMLDecl(ctxt);
    }
    else {
LAB_0013ed5e:
      pxVar11 = xmlCharStrdup("1.0");
      ctxt->version = pxVar11;
      if (pxVar11 == (xmlChar *)0x0) {
        xmlCtxtErrMemory(ctxt);
        break;
      }
    }
    p_Var12 = ctxt->sax;
    if (p_Var12 != (_xmlSAXHandler *)0x0) {
      if (p_Var12->setDocumentLocator != (setDocumentLocatorSAXFunc)0x0) {
        (*p_Var12->setDocumentLocator)(ctxt->userData,&xmlDefaultSAXLocator);
        p_Var12 = ctxt->sax;
        if (p_Var12 == (_xmlSAXHandler *)0x0) goto LAB_0013edb5;
      }
      if ((p_Var12->startDocument != (startDocumentSAXFunc)0x0) && (ctxt->disableSAX == 0)) {
        (*p_Var12->startDocument)(ctxt->userData);
      }
    }
LAB_0013edb5:
    ctxt->instate = XML_PARSER_MISC;
    break;
  case XML_PARSER_EOF:
    goto switchD_0013e92c_caseD_ffffffff;
  }
  if (ctxt->disableSAX != 0) goto switchD_0013e92c_caseD_ffffffff;
  goto LAB_0013e8f5;
}

Assistant:

int
xmlParseChunk(xmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    size_t curBase;
    size_t maxLength;
    size_t pos;
    int end_in_lf = 0;
    int res;

    if ((ctxt == NULL) || (size < 0))
        return(XML_ERR_ARGUMENT);
    if ((chunk == NULL) && (size > 0))
        return(XML_ERR_ARGUMENT);
    if ((ctxt->input == NULL) || (ctxt->input->buf == NULL))
        return(XML_ERR_ARGUMENT);
    if (ctxt->disableSAX != 0)
        return(ctxt->errNo);

    ctxt->input->flags |= XML_INPUT_PROGRESSIVE;
    if (ctxt->instate == XML_PARSER_START)
        xmlCtxtInitializeLate(ctxt);
    if ((size > 0) && (chunk != NULL) && (!terminate) &&
        (chunk[size - 1] == '\r')) {
	end_in_lf = 1;
	size--;
    }

    /*
     * Also push an empty chunk to make sure that the raw buffer
     * will be flushed if there is an encoder.
     */
    pos = ctxt->input->cur - ctxt->input->base;
    res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
    xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
    if (res < 0) {
        xmlCtxtErrIO(ctxt, ctxt->input->buf->error, NULL);
        xmlHaltParser(ctxt);
        return(ctxt->errNo);
    }

    xmlParseTryOrFinish(ctxt, terminate);

    curBase = ctxt->input->cur - ctxt->input->base;
    maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                XML_MAX_HUGE_LENGTH :
                XML_MAX_LOOKUP_LIMIT;
    if (curBase > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT,
                    "Buffer size limit exceeded, try XML_PARSE_HUGE\n");
        xmlHaltParser(ctxt);
    }

    if ((ctxt->errNo != XML_ERR_OK) && (ctxt->disableSAX != 0))
        return(ctxt->errNo);

    if (end_in_lf == 1) {
	pos = ctxt->input->cur - ctxt->input->base;
	res = xmlParserInputBufferPush(ctxt->input->buf, 1, "\r");
	xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
        if (res < 0) {
            xmlCtxtErrIO(ctxt, ctxt->input->buf->error, NULL);
            xmlHaltParser(ctxt);
            return(ctxt->errNo);
        }
    }
    if (terminate) {
	/*
	 * Check for termination
	 */
        if ((ctxt->instate != XML_PARSER_EOF) &&
            (ctxt->instate != XML_PARSER_EPILOG)) {
            if (ctxt->nameNr > 0) {
                const xmlChar *name = ctxt->nameTab[ctxt->nameNr - 1];
                int line = ctxt->pushTab[ctxt->nameNr - 1].line;
                xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NOT_FINISHED,
                        "Premature end of data in tag %s line %d\n",
                        name, line, NULL);
            } else if (ctxt->instate == XML_PARSER_START) {
                xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
            } else {
                xmlFatalErrMsg(ctxt, XML_ERR_DOCUMENT_EMPTY,
                               "Start tag expected, '<' not found\n");
            }
        } else if ((ctxt->input->buf->encoder != NULL) &&
                   (ctxt->input->buf->error == 0) &&
                   (!xmlBufIsEmpty(ctxt->input->buf->raw))) {
            xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                           "Truncated multi-byte sequence at EOF\n");
        }
	if (ctxt->instate != XML_PARSER_EOF) {
            ctxt->instate = XML_PARSER_EOF;
            xmlFinishDocument(ctxt);
	}
    }
    if (ctxt->wellFormed == 0)
	return((xmlParserErrors) ctxt->errNo);
    else
        return(0);
}